

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationEnd
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  char *pcVar5;
  String SVar6;
  String local_40;
  String local_30;
  
  ColoredPrintf(COLOR_GREEN,"[==========] ",CONCAT44(in_register_00000014,param_2));
  iVar2 = UnitTest::test_to_run_count(unit_test);
  FormatTestCount((testing *)&local_40,iVar2);
  pcVar5 = local_40.c_str_;
  iVar2 = UnitTest::test_case_to_run_count(unit_test);
  FormatTestCaseCount((testing *)&local_30,iVar2);
  printf("%s from %s ran.",pcVar5,local_30.c_str_);
  String::~String(&local_30);
  String::~String(&local_40);
  if (FLAGS_gtest_print_time == '\x01') {
    local_30.c_str_ = (char *)unit_test->impl_->elapsed_time_;
    SVar6 = StreamableToString<long_long>((internal *)&local_40,(longlong *)&local_30);
    printf(" (%s ms total)",local_40.c_str_,SVar6.length_);
    String::~String(&local_40);
  }
  putchar(10);
  ColoredPrintf(COLOR_GREEN,"[  PASSED  ] ");
  iVar2 = UnitTest::successful_test_count(unit_test);
  SVar6 = FormatTestCount((testing *)&local_40,iVar2);
  printf("%s.\n",local_40.c_str_,SVar6.length_);
  String::~String(&local_40);
  uVar3 = UnitTest::failed_test_count(unit_test);
  bVar1 = UnitTest::Passed(unit_test);
  if (!bVar1) {
    iVar2 = UnitTest::failed_test_count(unit_test);
    ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
    SVar6 = FormatTestCount((testing *)&local_40,iVar2);
    printf("%s, listed below:\n",local_40.c_str_,SVar6.length_);
    String::~String(&local_40);
    PrintFailedTests(unit_test);
    pcVar5 = "TESTS";
    if (uVar3 == 1) {
      pcVar5 = "TEST";
    }
    printf("\n%2d FAILED %s\n",(ulong)uVar3,pcVar5);
  }
  uVar4 = UnitTest::disabled_test_count(unit_test);
  if ((uVar4 != 0) && (FLAGS_gtest_also_run_disabled_tests == '\0')) {
    if (uVar3 == 0) {
      putchar(10);
    }
    pcVar5 = "TESTS";
    if (uVar4 == 1) {
      pcVar5 = "TEST";
    }
    ColoredPrintf(COLOR_YELLOW,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar4,pcVar5);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                     int /*iteration*/) {
  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,  "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  int num_failures = unit_test.failed_test_count();
  if (!unit_test.Passed()) {
    const int failed_test_count = unit_test.failed_test_count();
    ColoredPrintf(COLOR_RED,  "[  FAILED  ] ");
    printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());
    PrintFailedTests(unit_test);
    printf("\n%2d FAILED %s\n", num_failures,
                        num_failures == 1 ? "TEST" : "TESTS");
  }

  int num_disabled = unit_test.disabled_test_count();
  if (num_disabled && !GTEST_FLAG(also_run_disabled_tests)) {
    if (!num_failures) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(COLOR_YELLOW,
                  "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled,
                  num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}